

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

void sysbvm_dwarf_debugInfo_attribute_textAddress
               (sysbvm_dwarf_debugInfo_builder_t *builder,uintptr_t attribute,uintptr_t value)

{
  size_t sVar1;
  uint32_t addressOffset;
  
  sysbvm_dwarf_encodeULEB128(&builder->abbrev,attribute);
  sysbvm_dwarf_encodeULEB128(&builder->abbrev,1);
  sVar1 = sysbvm_dwarf_encodePointer(&builder->info,value);
  addressOffset = (uint32_t)sVar1;
  sysbvm_dynarray_add(&builder->infoTextAddresses,&addressOffset);
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_attribute_textAddress(sysbvm_dwarf_debugInfo_builder_t *builder, uintptr_t attribute, uintptr_t value)
{
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, attribute);
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, DW_FORM_addr);

    uint32_t addressOffset = (uint32_t)sysbvm_dwarf_encodePointer(&builder->info, value);
    sysbvm_dynarray_add(&builder->infoTextAddresses, &addressOffset);
}